

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

socket_handle FIX::socket_createAcceptor(int port,bool reuse)

{
  int s;
  int iVar1;
  sockaddr_in address;
  
  s = ::socket(2,1,0);
  if (s != -1) {
    address.sin_family = 2;
    address.sin_port = (ushort)port << 8 | (ushort)port >> 8;
    address.sin_addr.s_addr = 0;
    if (reuse) {
      socket_setsockopt(s,2);
    }
    iVar1 = bind(s,(sockaddr *)&address,0x10);
    if (iVar1 != -1) {
      iVar1 = listen(s,0x1000);
      if (iVar1 != -1) {
        return s;
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

socket_handle socket_createAcceptor(int port, bool reuse) {
  socket_handle socket = ::socket(PF_INET, SOCK_STREAM, 0);
  if (socket == INVALID_SOCKET_HANDLE) {
    return INVALID_SOCKET_HANDLE;
  }

  sockaddr_in address;
  socklen_t socklen;

  address.sin_family = PF_INET;
  address.sin_port = htons(port);
  address.sin_addr.s_addr = INADDR_ANY;
  socklen = sizeof(address);
  if (reuse) {
    socket_setsockopt(socket, SO_REUSEADDR);
  }

  int result = bind(socket, reinterpret_cast<sockaddr *>(&address), socklen);

  if (result == BIND_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  result = listen(socket, SOMAXCONN);
  if (result == LISTEN_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  return socket;
}